

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

uint32_t nni_msg_header_trim_u32(nni_msg *m)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint8_t *dst;
  uint32_t val;
  nni_msg *m_local;
  
  uVar4 = m->m_header_buf[0];
  bVar1 = *(byte *)((long)m->m_header_buf + 1);
  bVar2 = *(byte *)((long)m->m_header_buf + 2);
  bVar3 = *(byte *)((long)m->m_header_buf + 3);
  m->m_header_len = m->m_header_len - 4;
  memmove(m,m->m_header_buf + 1,m->m_header_len);
  return (uint)(byte)uVar4 * 0x1000000 + (uint)bVar1 * 0x10000 + (uint)bVar2 * 0x100 + (uint)bVar3;
}

Assistant:

uint32_t
nni_msg_header_trim_u32(nni_msg *m)
{
	uint32_t val;
	uint8_t *dst;
	dst = (void *) m->m_header_buf;
	NNI_GET32(dst, val);
	m->m_header_len -= sizeof(val);
	memmove(m->m_header_buf, &m->m_header_buf[1], m->m_header_len);
	return (val);
}